

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::getedge(tetgenmesh *this,point e1,point e2,triface *tedge)

{
  uint *puVar1;
  uint uVar2;
  arraypool *this_00;
  ulong uVar3;
  long lVar4;
  char **ppcVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  tetrahedron *pppdVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  tetrahedron *pppdVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  
  if (2 < this->b->verbose) {
    printf("      Get edge from %d to %d.\n",
           (ulong)*(uint *)((long)e1 + (long)this->pointmarkindex * 4),
           (ulong)*(uint *)((long)e2 + (long)this->pointmarkindex * 4));
  }
  pppdVar9 = tedge->tet;
  if ((pppdVar9 == (tetrahedron *)0x0) || (pppdVar9[4] == (tetrahedron)0x0)) {
LAB_0011ba4b:
    pppdVar9 = (tetrahedron *)((ulong)e1[this->point2simindex] & 0xfffffffffffffff0);
    tedge->tet = pppdVar9;
    if (pppdVar9[4] == (tetrahedron)e1) {
      iVar15 = 0xb;
    }
    else if (pppdVar9[5] == (tetrahedron)e1) {
      iVar15 = 3;
    }
    else {
      iVar15 = 7;
      if (pppdVar9[6] != (tetrahedron)e1) {
        iVar15 = 0;
      }
    }
    tedge->ver = iVar15;
    finddirection(this,tedge,e2);
    iVar15 = 1;
    if (tedge->tet[destpivot[tedge->ver]] != (tetrahedron)e2) {
      pppdVar9 = (tetrahedron *)((ulong)e2[this->point2simindex] & 0xfffffffffffffff0);
      tedge->tet = pppdVar9;
      if (pppdVar9[4] == (tetrahedron)e2) {
        iVar7 = 0xb;
      }
      else if (pppdVar9[5] == (tetrahedron)e2) {
        iVar7 = 3;
      }
      else {
        iVar7 = 7;
        if (pppdVar9[6] != (tetrahedron)e2) {
          iVar7 = 0;
        }
      }
      tedge->ver = iVar7;
      finddirection(this,tedge,e1);
      if (tedge->tet[destpivot[tedge->ver]] == (tetrahedron)e1) {
        tedge->ver = esymtbl[tedge->ver];
      }
      else {
        pppdVar9 = (tetrahedron *)((ulong)e1[this->point2simindex] & 0xfffffffffffffff0);
        if (pppdVar9[4] == (tetrahedron)e1) {
          lVar12 = 0xb;
        }
        else if (pppdVar9[5] == (tetrahedron)e1) {
          lVar12 = 3;
        }
        else {
          lVar12 = 7;
          if (pppdVar9[6] != (tetrahedron)e1) {
            lVar12 = 0;
          }
        }
        this_00 = this->cavebdrylist;
        iVar7 = enextesymtbl[lVar12];
        iVar8 = 3;
        do {
          if (pppdVar9[apexpivot[iVar7]] == (tetrahedron)e2) {
            tedge->tet = pppdVar9;
            iVar7 = eorgoppotbl[iVar7];
            goto LAB_0011bdeb;
          }
          iVar7 = enexttbl[iVar7];
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        pppdVar14 = (tetrahedron *)((ulong)pppdVar9[facepivot1[iVar7]] & 0xfffffffffffffff0);
        iVar8 = esymtbl[facepivot2[iVar7][(uint)pppdVar9[facepivot1[iVar7]] & 0xf]];
        if (pppdVar14[apexpivot[iVar8]] == (tetrahedron)e2) {
          tedge->tet = pppdVar14;
          iVar7 = eorgoppotbl[iVar8];
LAB_0011bdeb:
          tedge->ver = iVar7;
        }
        else {
          puVar1 = (uint *)((long)pppdVar9 + (long)this->elemmarkerindex * 4);
          *puVar1 = *puVar1 | 1;
          pcVar10 = arraypool::getblock(this_00,(int)this_00->objects);
          lVar12 = (long)this_00->objectbytes *
                   ((long)this_00->objectsperblock - 1U & this_00->objects);
          lVar16 = this_00->objects + 1;
          this_00->objects = lVar16;
          *(tetrahedron **)(pcVar10 + lVar12) = pppdVar9;
          *(int *)(pcVar10 + lVar12 + 8) = iVar7;
          puVar1 = (uint *)((long)pppdVar14 + (long)this->elemmarkerindex * 4);
          *puVar1 = *puVar1 | 1;
          pcVar10 = arraypool::getblock(this_00,(int)lVar16);
          uVar3 = this_00->objects;
          lVar16 = (long)this_00->objectbytes;
          lVar17 = ((long)this_00->objectsperblock - 1U & uVar3) * lVar16;
          lVar12 = uVar3 + 1;
          this_00->objects = lVar12;
          *(tetrahedron **)(pcVar10 + lVar17) = pppdVar14;
          *(int *)(pcVar10 + lVar17 + 8) = iVar8;
          if ((long)uVar3 < 0) {
            iVar15 = 0;
          }
          else {
            lVar17 = 0;
            do {
              lVar11 = (long)(int)((this_00->objectsperblockmark & (uint)lVar17) * (int)lVar16);
              lVar4 = *(long *)(this_00->toparray
                                [(uint)lVar17 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                               lVar11);
              iVar7 = *(int *)(this_00->toparray
                               [(uint)lVar17 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                              lVar11 + 8);
              bVar6 = true;
              do {
                bVar13 = bVar6;
                iVar7 = enexttbl[iVar7];
                uVar3 = *(ulong *)(lVar4 + (long)facepivot1[iVar7] * 8);
                pppdVar9 = (tetrahedron *)(uVar3 & 0xfffffffffffffff0);
                uVar2 = *(uint *)((long)pppdVar9 + (long)this->elemmarkerindex * 4);
                if ((uVar2 & 1) == 0) {
                  iVar15 = esymtbl[facepivot2[iVar7][(uint)uVar3 & 0xf]];
                  if (pppdVar9[apexpivot[iVar15]] == (tetrahedron)e2) {
                    tedge->tet = pppdVar9;
                    tedge->ver = eorgoppotbl[iVar15];
                    iVar15 = 1;
                    goto LAB_0011be14;
                  }
                  *(uint *)((long)pppdVar9 + (long)this->elemmarkerindex * 4) = uVar2 | 1;
                  pcVar10 = arraypool::getblock(this_00,(int)lVar12);
                  lVar16 = (long)this_00->objectbytes;
                  lVar11 = ((long)this_00->objectsperblock - 1U & this_00->objects) * lVar16;
                  lVar12 = this_00->objects + 1;
                  this_00->objects = lVar12;
                  *(tetrahedron **)(pcVar10 + lVar11) = pppdVar9;
                  *(int *)(pcVar10 + lVar11 + 8) = iVar15;
                }
                iVar15 = 0;
                bVar6 = false;
              } while (bVar13);
              lVar17 = lVar17 + 1;
            } while (lVar17 < lVar12);
LAB_0011be14:
            if (0 < lVar12) {
              ppcVar5 = this_00->toparray;
              lVar16 = 0;
              do {
                puVar1 = (uint *)(*(long *)(ppcVar5[(uint)lVar16 >>
                                                    ((byte)this_00->log2objectsperblock & 0x1f)] +
                                           (long)this_00->objectbytes *
                                           (long)(int)(this_00->objectsperblockmark & (uint)lVar16))
                                 + (long)this->elemmarkerindex * 4);
                *puVar1 = *puVar1 & 0xfffffffe;
                lVar16 = lVar16 + 1;
              } while (lVar12 != lVar16);
            }
          }
          this_00->objects = 0;
        }
      }
    }
  }
  else {
    iVar15 = tedge->ver;
    if (pppdVar9[orgpivot[iVar15]] == (tetrahedron)e1) {
      if (pppdVar9[destpivot[iVar15]] != (tetrahedron)e2) goto LAB_0011ba4b;
    }
    else {
      if ((pppdVar9[orgpivot[iVar15]] != (tetrahedron)e2) ||
         (pppdVar9[destpivot[iVar15]] != (tetrahedron)e1)) goto LAB_0011ba4b;
      tedge->ver = esymtbl[iVar15];
    }
    iVar15 = 1;
  }
  return iVar15;
}

Assistant:

int tetgenmesh::getedge(point e1, point e2, triface *tedge)
{
  triface searchtet, neightet, *parytet;
  point pt;
  int done;
  int i, j;

  if (b->verbose > 2) {
    printf("      Get edge from %d to %d.\n", pointmark(e1), pointmark(e2));
  }

  // Quickly check if 'tedge' is just this edge.
  if (!isdeadtet(*tedge)) {
    if (org(*tedge) == e1) {
      if (dest(*tedge) == e2) {
        return 1;
      }
    } else if (org(*tedge) == e2) {
      if (dest(*tedge) == e1) {
        esymself(*tedge);
        return 1;
      }
    }
  }

  // Search for the edge [e1, e2].
  point2tetorg(e1, *tedge);
  finddirection(tedge, e2);
  if (dest(*tedge) == e2) {
    return 1;
  } else {
    // Search for the edge [e2, e1].
    point2tetorg(e2, *tedge);
    finddirection(tedge, e1);
    if (dest(*tedge) == e1) {
      esymself(*tedge);
      return 1;
    }
  }


  // Go to the link face of e1.
  point2tetorg(e1, searchtet);
  enextesymself(searchtet);
  arraypool *tetlist = cavebdrylist;

  // Search e2.
  for (i = 0; i < 3; i++) {
    pt = apex(searchtet);
    if (pt == e2) {
      // Found. 'searchtet' is [#,#,e2,e1].
      eorgoppo(searchtet, *tedge); // [e1,e2,#,#].
      return 1;
    }
    enextself(searchtet);
  }

  // Get the adjacent link face at 'searchtet'.
  fnext(searchtet, neightet);
  esymself(neightet);
  // assert(oppo(neightet) == e1);
  pt = apex(neightet);
  if (pt == e2) {
    // Found. 'neightet' is [#,#,e2,e1].
    eorgoppo(neightet, *tedge); // [e1,e2,#,#].
    return 1;
  }

  // Continue searching in the link face of e1.
  infect(searchtet);
  tetlist->newindex((void **) &parytet);
  *parytet = searchtet;
  infect(neightet);
  tetlist->newindex((void **) &parytet);
  *parytet = neightet;

  done = 0;

  for (i = 0; (i < tetlist->objects) && !done; i++) {
    parytet = (triface *) fastlookup(tetlist, i);
    searchtet = *parytet;
    for (j = 0; (j < 2) && !done; j++) {
      enextself(searchtet);
      fnext(searchtet, neightet);
      if (!infected(neightet)) {        
        esymself(neightet);
        pt = apex(neightet);
        if (pt == e2) {
          // Found. 'neightet' is [#,#,e2,e1].
          eorgoppo(neightet, *tedge);
          done = 1;
        } else {
          infect(neightet);
          tetlist->newindex((void **) &parytet);
          *parytet = neightet;
        }
      }
    } // j
  } // i 

  // Uninfect the list of visited tets.
  for (i = 0; i < tetlist->objects; i++) {
    parytet = (triface *) fastlookup(tetlist, i);
    uninfect(*parytet);
  }
  tetlist->restart();

  return done;
}